

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void take_aarch32_exception
               (CPUARMState_conflict *env,int new_mode,uint32_t mask,uint32_t offset,uint32_t newpc)

{
  ulong uVar1;
  uint32_t uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  
  switch_mode(env,new_mode);
  uVar3 = env->uncached_cpsr;
  env->uncached_cpsr = uVar3 & 0xffdfffff;
  uVar2 = cpsr_read_aarch64(env);
  env->spsr = uVar2;
  env->condexec_bits = 0;
  uVar8 = uVar3 & 0xffdfffe0 | new_mode;
  env->uncached_cpsr = uVar8;
  uVar1 = env->features;
  uVar3 = (uint)uVar1;
  if ((uVar3 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar5 = new_mode & 0x1f;
      if (uVar5 == 0x10) {
        uVar5 = 0;
      }
      else if (uVar5 == 0x16) {
        uVar5 = 3;
      }
      else if (uVar5 == 0x1a) {
        uVar5 = 2;
      }
      else {
        if ((uVar1 >> 0x21 & 1) != 0) {
          bVar9 = uVar5 == 0x16;
          if (!bVar9) {
            bVar9 = ((env->cp15).scr_el3 & 1) == 0;
          }
          if (((uVar3 >> 0x1c & 1) == 0) && (uVar5 = 3, bVar9)) goto LAB_00622fd7;
        }
        uVar5 = 1;
      }
    }
    else {
      uVar5 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar5 = 1;
    if ((env->v7m).exception == 0) {
      uVar5 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_00622fd7:
  env->uncached_cpsr = uVar8 & 0xfffffdff;
  uVar6 = (ulong)uVar5;
  if ((*(byte *)((long)(env->cp15).cptr_el + uVar6 * 8 + -0x25) & 2) != 0) {
    env->uncached_cpsr = uVar8 | 0x200;
  }
  uVar8 = env->uncached_cpsr;
  uVar7 = uVar8 & 0xfeefffff;
  env->uncached_cpsr = uVar7;
  env->daif = env->daif | (ulong)mask;
  if (new_mode == 0x1a) {
    env->thumb = *(uint *)((long)&(env->cp15).field_2 + 0x10) >> 0x1e & 1;
    env->elr_el[2] = (ulong)env->regs[0xf];
    goto LAB_00623139;
  }
  if ((*(byte *)((long)env[1].xregs + 0x62) & 0xf) != 0) {
    if (uVar6 == 1) {
LAB_00623072:
      if ((*(byte *)((long)(env->cp15).cptr_el + uVar6 * 8 + -0x26) & 0x80) == 0) {
        uVar7 = uVar7 | 0x400000;
LAB_006230b0:
        env->uncached_cpsr = uVar7;
      }
    }
    else if (uVar5 == 3) {
      if (((uVar1 >> 0x21 & 1) != 0) && (((env->cp15).scr_el3 & 1) == 0)) goto LAB_00623072;
      uVar7 = uVar8 & 0xfeafffff;
      goto LAB_006230b0;
    }
  }
  if ((uVar3 >> 0xe & 1) != 0) {
    if ((uVar1 >> 0x21 & 1) == 0) {
LAB_006230c4:
      lVar4 = 0x2a8;
    }
    else {
      if (env->aarch64 == 0) {
        bVar9 = (env->uncached_cpsr & 0x1f) == 0x16;
      }
      else {
        bVar9 = (~env->pstate & 0xc) == 0;
      }
      if (!bVar9) {
        bVar9 = ((env->cp15).scr_el3 & 1) == 0;
      }
      if (((uVar3 >> 0x1c & 1) != 0) || (lVar4 = 0x2b8, !bVar9)) goto LAB_006230c4;
    }
    env->thumb = *(uint *)((long)env->regs + lVar4) >> 0x1e & 1;
  }
  env->regs[0xe] = offset + env->regs[0xf];
LAB_00623139:
  env->regs[0xf] = newpc;
  arm_rebuild_hflags_aarch64(env);
  return;
}

Assistant:

static void take_aarch32_exception(CPUARMState *env, int new_mode,
                                   uint32_t mask, uint32_t offset,
                                   uint32_t newpc)
{
    int new_el;

    /* Change the CPU state so as to actually take the exception. */
    switch_mode(env, new_mode);

    /*
     * For exceptions taken to AArch32 we must clear the SS bit in both
     * PSTATE and in the old-state value we save to SPSR_<mode>, so zero it now.
     */
    env->uncached_cpsr &= ~PSTATE_SS;
    env->spsr = cpsr_read(env);
    /* Clear IT bits.  */
    env->condexec_bits = 0;
    /* Switch to the new mode, and to the correct instruction set.  */
    env->uncached_cpsr = (env->uncached_cpsr & ~CPSR_M) | new_mode;

    /* This must be after mode switching. */
    new_el = arm_current_el(env);

    /* Set new mode endianness */
    env->uncached_cpsr &= ~CPSR_E;
    if (env->cp15.sctlr_el[new_el] & SCTLR_EE) {
        env->uncached_cpsr |= CPSR_E;
    }
    /* J and IL must always be cleared for exception entry */
    env->uncached_cpsr &= ~(CPSR_IL | CPSR_J);
    env->daif |= mask;

    if (new_mode == ARM_CPU_MODE_HYP) {
        env->thumb = (env->cp15.sctlr_el[2] & SCTLR_TE) != 0;
        env->elr_el[2] = env->regs[15];
    } else {
        /* CPSR.PAN is normally preserved preserved unless...  */
        if (cpu_isar_feature(aa32_pan, env_archcpu(env))) {
            switch (new_el) {
            case 3:
                if (!arm_is_secure_below_el3(env)) {
                    /* ... the target is EL3, from non-secure state.  */
                    env->uncached_cpsr &= ~CPSR_PAN;
                    break;
                }
                /* ... the target is EL3, from secure state ... */
                /* fall through */
            case 1:
                /* ... the target is EL1 and SCTLR.SPAN is 0.  */
                if (!(env->cp15.sctlr_el[new_el] & SCTLR_SPAN)) {
                    env->uncached_cpsr |= CPSR_PAN;
                }
                break;
            }
        }
        /*
         * this is a lie, as there was no c1_sys on V4T/V5, but who cares
         * and we should just guard the thumb mode on V4
         */
        if (arm_feature(env, ARM_FEATURE_V4T)) {
            env->thumb =
                (A32_BANKED_CURRENT_REG_GET(env, sctlr) & SCTLR_TE) != 0;
        }
        env->regs[14] = env->regs[15] + offset;
    }
    env->regs[15] = newpc;
    arm_rebuild_hflags(env);
}